

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall
fuzzFailures_convFailures_Test::fuzzFailures_convFailures_Test(fuzzFailures_convFailures_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001b2b90;
  return;
}

Assistant:

TEST(fuzzFailures, convFailures)
{
    EXPECT_NO_THROW(unit_from_string("+z264"));
    EXPECT_NO_THROW(unit_from_string("+4560"));
    EXPECT_NO_THROW(unit_from_string("24250v"));
    EXPECT_NO_THROW(unit_from_string("8("));
    EXPECT_NO_THROW(unit_from_string("8{"));
    EXPECT_NO_THROW(unit_from_string("0^%"));
    EXPECT_NO_THROW(unit_from_string("10*1001"));
    EXPECT_NO_THROW(unit_from_string("s)^(z()."));
    EXPECT_NO_THROW(unit_from_string("--+10*+1+110 U"));
    EXPECT_NO_THROW(unit_from_string("EQXUN[{ ["));
}